

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobject.cpp
# Opt level: O2

QUntypedBindable __thiscall QMetaProperty::bindable(QMetaProperty *this,QObject *object)

{
  uint uVar1;
  uint *puVar2;
  uint *puVar3;
  QUntypedBindable QVar4;
  int iVar5;
  long in_FS_OFFSET;
  QUntypedPropertyData *local_48;
  QBindableInterface *pQStack_40;
  undefined1 *local_30;
  long local_28;
  
  local_30 = (undefined1 *)&local_48;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = (QUntypedPropertyData *)0x0;
  pQStack_40 = (QBindableInterface *)0x0;
  puVar2 = (this->data).d;
  puVar3 = (this->mobj->d).data;
  uVar1 = puVar3[7];
  iVar5 = QMetaObject::propertyOffset(this->mobj);
  QMetaObject::metacall
            (object,BindableProperty,
             ((int)((ulong)((long)puVar2 - (long)puVar3) >> 2) - uVar1) / 5 + iVar5,&local_30);
  QVar4.iface = pQStack_40;
  QVar4.data = local_48;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return QVar4;
  }
  __stack_chk_fail();
}

Assistant:

QUntypedBindable QMetaProperty::bindable(QObject *object) const
{
    QUntypedBindable bindable;
    void * argv[1] { &bindable };
    mobj->metacall(object, QMetaObject::BindableProperty, data.index(mobj) + mobj->propertyOffset(), argv);
    return bindable;
}